

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_executor.cpp
# Opt level: O3

void __thiscall
duckdb::ExpressionExecutor::Verify
          (ExpressionExecutor *this,Expression *expr,Vector *vector,idx_t count)

{
  pointer this_00;
  
  Vector::Verify(vector,count);
  if ((expr->verification_stats).
      super_unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>._M_t.
      super___uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>
      .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl != (BaseStatistics *)0x0)
  {
    this_00 = unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
              ::operator->(&expr->verification_stats);
    BaseStatistics::Verify(this_00,vector,count);
  }
  if (this->debug_vector_verification == DICTIONARY_EXPRESSION) {
    Vector::DebugTransformToDictionary(vector,count);
    return;
  }
  return;
}

Assistant:

void ExpressionExecutor::Verify(const Expression &expr, Vector &vector, idx_t count) {
	D_ASSERT(expr.return_type.id() == vector.GetType().id());
	vector.Verify(count);
	if (expr.verification_stats) {
		expr.verification_stats->Verify(vector, count);
	}
	if (debug_vector_verification == DebugVectorVerification::DICTIONARY_EXPRESSION) {
		Vector::DebugTransformToDictionary(vector, count);
	}
}